

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O3

QPointF __thiscall QGestureEvent::mapToGraphicsScene(QGestureEvent *this,QPointF *gesturePoint)

{
  bool bVar1;
  QWidget *this_00;
  long in_FS_OFFSET;
  double dVar2;
  QPointF QVar3;
  QPoint local_28;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
  if (this_00 == (QWidget *)0x0) {
    QVar3 = (QPointF)ZEXT816(0);
  }
  else {
    dVar2 = (double)((ulong)gesturePoint->xp & 0x8000000000000000 | 0x3fe0000000000000) +
            gesturePoint->xp;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    dVar2 = (double)((ulong)gesturePoint->yp & 0x8000000000000000 | 0x3fe0000000000000) +
            gesturePoint->yp;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    local_20 = QWidget::mapFromGlobal(this_00,&local_28);
    QVar3 = QGraphicsView::mapToScene((QGraphicsView *)this_00,&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGestureEvent::mapToGraphicsScene(const QPointF &gesturePoint) const
{
    QWidget *w = widget();
    if (w) // we get the viewport as widget, not the graphics view
        w = w->parentWidget();
    QGraphicsView *view = qobject_cast<QGraphicsView*>(w);
    if (view) {
        return view->mapToScene(view->mapFromGlobal(gesturePoint.toPoint()));
    }
    return QPointF();
}